

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::requantize_int8_to_int8
               (Mat *src,Mat *dst,float scale_in,float scale_out,float *bias,int bias_data_size,
               int fusion_relu,Option *opt)

{
  Layer *pLVar1;
  int in_ECX;
  void *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  undefined8 in_R9;
  float in_XMM0_Da;
  float in_XMM1_Da;
  Mat weights [1];
  ParamDict pd;
  Layer *requantize;
  Mat *in_stack_fffffffffffff5a8;
  Mat *in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b8;
  int in_stack_fffffffffffff5bc;
  ParamDict *in_stack_fffffffffffff5c0;
  Mat *local_a18;
  ParamDict *in_stack_fffffffffffff5f0;
  Mat *local_9e8;
  undefined1 local_9d8 [16];
  Mat local_9c8;
  Mat local_988;
  undefined1 auStack_948 [2320];
  Layer *local_38;
  undefined8 local_30;
  int local_28;
  int local_24;
  void *local_20;
  float local_18;
  float local_14;
  undefined8 local_10;
  undefined8 local_8;
  
  local_30 = in_R9;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = create_layer(in_stack_fffffffffffff5bc);
  ParamDict::ParamDict(in_stack_fffffffffffff5f0);
  ParamDict::set((ParamDict *)(auStack_948 + 0x10),0,local_14);
  ParamDict::set((ParamDict *)(auStack_948 + 0x10),1,local_18);
  ParamDict::set((ParamDict *)(auStack_948 + 0x10),2,(uint)(local_20 != (void *)0x0));
  ParamDict::set((ParamDict *)(auStack_948 + 0x10),3,local_24);
  ParamDict::set((ParamDict *)(auStack_948 + 0x10),4,local_28);
  (*local_38->_vptr_Layer[2])(local_38,auStack_948 + 0x10);
  local_9e8 = &local_988;
  do {
    Mat::Mat(local_9e8);
    local_9e8 = local_9e8 + 1;
  } while (local_9e8 != (Mat *)auStack_948);
  Mat::Mat(&local_9c8,local_24,local_20,4,(Allocator *)0x0);
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                 in_stack_fffffffffffff5b0);
  Mat::~Mat((Mat *)0x12a6c9);
  pLVar1 = local_38;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  (*pLVar1->_vptr_Layer[3])(pLVar1,local_9d8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x12a712);
  (*local_38->_vptr_Layer[4])(local_38,local_30);
  (*local_38->_vptr_Layer[7])(local_38,local_8,local_10,local_30);
  (*local_38->_vptr_Layer[5])(local_38,local_30);
  if (local_38 != (Layer *)0x0) {
    (*local_38->_vptr_Layer[1])();
  }
  local_a18 = (Mat *)auStack_948;
  do {
    local_a18 = local_a18 + -1;
    Mat::~Mat((Mat *)0x12a7ba);
  } while (local_a18 != &local_988);
  ParamDict::~ParamDict(in_stack_fffffffffffff5c0);
  return;
}

Assistant:

void requantize_int8_to_int8(const Mat& src, Mat& dst, float scale_in, float scale_out, const float* bias, int bias_data_size, int fusion_relu, const Option& opt)
{
    Layer* requantize = create_layer(LayerType::Requantize);

    ParamDict pd;
    pd.set(0, scale_in);
    pd.set(1, scale_out);
    pd.set(2, bias ? 1 : 0);
    pd.set(3, bias_data_size);
    pd.set(4, fusion_relu);

    requantize->load_param(pd);

    Mat weights[1];
    weights[0] = Mat(bias_data_size, (void*)bias);

    requantize->load_model(ModelBinFromMatArray(weights));

    requantize->create_pipeline(opt);

    requantize->forward(src, dst, opt);

    requantize->destroy_pipeline(opt);

    delete requantize;
}